

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int update_timer(Curl_multi *multi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  __suseconds_t _Var3;
  CURLMcode CVar4;
  int iVar5;
  Curl_tree *in_RAX;
  long timeout_ms;
  
  if (multi->timer_cb != (curl_multi_timer_callback)0x0) {
    timeout_ms = (long)in_RAX;
    CVar4 = multi_timeout(multi,&timeout_ms);
    in_RAX = (Curl_tree *)(ulong)(uint)CVar4;
    if (timeout_ms < 0) {
      if (((multi->timer_lastcall).tv_sec == 0) && ((multi->timer_lastcall).tv_usec == 0))
      goto LAB_004b9ddb;
      (multi->timer_lastcall).tv_sec = 0;
      (multi->timer_lastcall).tv_usec = 0;
      timeout_ms = -1;
    }
    else {
      in_RAX = multi->timetree;
      if (((in_RAX->key).tv_sec == (multi->timer_lastcall).tv_sec) &&
         ((in_RAX->key).tv_usec == (multi->timer_lastcall).tv_usec)) goto LAB_004b9ddb;
      uVar1 = *(undefined4 *)((long)&(in_RAX->key).tv_sec + 4);
      _Var3 = (in_RAX->key).tv_usec;
      uVar2 = *(undefined4 *)((long)&(in_RAX->key).tv_usec + 4);
      *(int *)&(multi->timer_lastcall).tv_sec = (int)(in_RAX->key).tv_sec;
      *(undefined4 *)((long)&(multi->timer_lastcall).tv_sec + 4) = uVar1;
      *(int *)&(multi->timer_lastcall).tv_usec = (int)_Var3;
      *(undefined4 *)((long)&(multi->timer_lastcall).tv_usec + 4) = uVar2;
    }
    iVar5 = (*multi->timer_cb)(multi,timeout_ms,multi->timer_userp);
    return iVar5;
  }
LAB_004b9ddb:
  return (int)in_RAX;
}

Assistant:

static int update_timer(struct Curl_multi *multi)
{
  long timeout_ms;

  if(!multi->timer_cb)
    return 0;
  if(multi_timeout(multi, &timeout_ms)) {
    return -1;
  }
  if(timeout_ms < 0) {
    static const struct timeval none={0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      return multi->timer_cb(multi, -1, multi->timer_userp);
    }
    return 0;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return 0;

  multi->timer_lastcall = multi->timetree->key;

  return multi->timer_cb(multi, timeout_ms, multi->timer_userp);
}